

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_1a3010::CreateLoad
                    (ExpressionContext *ctx,VmModule *module,SynBase *source,TypeBase *type,
                    VmValue *address,uint offset)

{
  VmValue *pVVar1;
  VmInstructionType VVar2;
  ExpressionContext *this;
  VmConstant *first;
  VmType VVar3;
  SynBase *local_70;
  TypeBase *local_68;
  ExpressionContext *local_50;
  VmConstant *reference;
  VmConstant *spill;
  VmValue *pVStack_38;
  uint offset_local;
  VmValue *address_local;
  TypeBase *type_local;
  SynBase *source_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  spill._4_4_ = offset;
  pVStack_38 = address;
  address_local = (VmValue *)type;
  type_local = (TypeBase *)source;
  source_local = (SynBase *)module;
  module_local = (VmModule *)ctx;
  if (type->size == 0) {
    ctx_local = (ExpressionContext *)CreateConstantStruct(ctx->allocator,source,(char *)0x0,0,type);
  }
  else if (type->size < 0x41) {
    VVar3 = GetLoadResultType(ctx,type);
    VVar2 = GetLoadInstruction((ExpressionContext *)module_local,(TypeBase *)address_local);
    pVVar1 = pVStack_38;
    first = CreateConstantInt((Allocator *)module_local[6].loadStoreInfo.little[0xf].loadPointer,
                              (SynBase *)type_local,spill._4_4_);
    local_70 = VVar3._0_8_;
    local_68 = VVar3.structType;
    VVar3.structType._0_4_ = VVar2;
    VVar3._0_8_ = local_68;
    VVar3.structType._4_4_ = 0;
    ctx_local = (ExpressionContext *)
                CreateInstruction((anon_unknown_dwarf_1a3010 *)module,(VmModule *)source,local_70,
                                  VVar3,(VmInstructionType)pVVar1,&first->super_VmValue,
                                  (VmValue *)module);
  }
  else {
    reference = CreateAlloca(ctx,module,source,type,"spill",true);
    CreateMemCopy((VmModule *)source_local,(SynBase *)type_local,&reference->super_VmValue,0,
                  pVStack_38,spill._4_4_,(int)(address_local->comment).end);
    this = (ExpressionContext *)VmModule::get<VmConstant>((VmModule *)source_local);
    pVVar1 = module_local[6].loadStoreInfo.little[0xf].loadPointer;
    VVar3 = GetVmType((ExpressionContext *)module_local,(TypeBase *)address_local);
    VmConstant::VmConstant((VmConstant *)this,(Allocator *)pVVar1,VVar3,(SynBase *)type_local);
    *(int *)((this->uniqueDependencies).little + 0xd) = reference->iValue;
    (this->uniqueDependencies).little[0x13] = (ModuleData *)reference->container;
    *(undefined1 *)((long)(this->uniqueDependencies).little + 0xa1) = 1;
    local_50 = this;
    SmallArray<VmConstant_*,_8U>::push_back
              ((SmallArray<VmConstant_*,_8U> *)((this->uniqueDependencies).little[0x13] + 1),
               (VmConstant **)&local_50);
    ctx_local = local_50;
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* CreateLoad(ExpressionContext &ctx, VmModule *module, SynBase *source, TypeBase *type, VmValue *address, unsigned offset)
	{
		if(type->size == 0)
			return CreateConstantStruct(ctx.allocator, source, NULL, 0, type);

		if(type->size > spillTypeSize)
		{
			VmConstant *spill = CreateAlloca(ctx, module, source, type, "spill", true);

			CreateMemCopy(module, source, spill, 0, address, offset, (int)type->size);

			VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, GetVmType(ctx, type), source);

			reference->iValue = spill->iValue;
			reference->container = spill->container;
			reference->isReference = true;

			reference->container->users.push_back(reference);

			return reference;
		}

		return CreateInstruction(module, source, GetLoadResultType(ctx, type), GetLoadInstruction(ctx, type), address, CreateConstantInt(ctx.allocator, source, offset));
	}